

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O0

int __thiscall
hbm::SocketNonblocking::connect(SocketNonblocking *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  char *__name;
  char *__service;
  int *piVar2;
  undefined4 in_register_00000034;
  bool bVar3;
  socklen_t len;
  int value;
  pollfd pfd;
  int err;
  addrinfo *pResult;
  addrinfo hints;
  int retVal;
  socklen_t local_74;
  int local_70;
  pollfd local_6c;
  int local_64;
  addrinfo *local_60;
  addrinfo local_58;
  int local_24;
  sockaddr *local_20;
  EVP_PKEY_CTX *local_18;
  SocketNonblocking *local_10;
  int local_4;
  
  local_18 = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd);
  local_20 = __addr;
  local_10 = this;
  local_24 = init(this,local_18);
  local_4 = local_24;
  if (-1 < local_24) {
    local_60 = (addrinfo *)0x0;
    memset(&local_58,0,0x30);
    local_58.ai_family = 0;
    local_58.ai_socktype = 1;
    __name = (char *)std::__cxx11::string::c_str();
    __service = (char *)std::__cxx11::string::c_str();
    iVar1 = getaddrinfo(__name,__service,&local_58,&local_60);
    if (iVar1 == 0) {
      local_64 = ::connect(this->m_fd,local_60->ai_addr,0x10);
      freeaddrinfo(local_60);
      if (local_64 == -1) {
        piVar2 = __errno_location();
        if (*piVar2 == 0x73) {
          local_6c.fd = this->m_fd;
          local_6c.events = 4;
          do {
            local_64 = poll(&local_6c,1,5000);
            bVar3 = false;
            if (local_64 == -1) {
              piVar2 = __errno_location();
              bVar3 = *piVar2 == 4;
            }
          } while (bVar3);
          if (local_64 == 1) {
            local_74 = 4;
            iVar1 = getsockopt(this->m_fd,1,4,&local_70,&local_74);
            if (iVar1 == 0) {
              if (local_70 != 0) {
                local_24 = -1;
              }
            }
            else {
              local_24 = -1;
            }
          }
          else {
            local_24 = -1;
          }
        }
        else {
          local_24 = -1;
        }
      }
      local_4 = local_24;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int hbm::SocketNonblocking::connect(const std::string &address, const std::string& port)
{
	int retVal = init();
	if(retVal<0) {
		return retVal;
	}


	struct addrinfo hints;
	struct addrinfo* pResult = NULL;

	memset(&hints, 0, sizeof(hints));

	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;


	if( getaddrinfo(address.c_str(), port.c_str(), &hints, &pResult)!=0 ) {
		return -1;
	}
	int err = ::connect(m_fd, pResult->ai_addr, sizeof(sockaddr_in));
	freeaddrinfo( pResult );
	if(err==-1) {
		if(errno == EINPROGRESS) {
			// success if errno equals EINPROGRESS
			struct pollfd pfd;
			pfd.fd = m_fd;
			pfd.events = POLLOUT;
			do {
				err = poll(&pfd, 1, TIMEOUT_CONNECT_S*1000);
			} while((err==-1) && (errno==EINTR) );
			if(err==1) {
				int value;
				socklen_t len = sizeof(value);
				if (getsockopt(m_fd, SOL_SOCKET, SO_ERROR, &value, &len) != 0) {
					retVal = -1;
				} else if(value!=0) {
					retVal = -1;
				}
			} else {
				retVal = -1;
			}
		} else {
			retVal = -1;
		}
	}
	return retVal;
}